

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
RegisterDepfileParserTestUnifyMixedRulesLF::RegisterDepfileParserTestUnifyMixedRulesLF
          (RegisterDepfileParserTestUnifyMixedRulesLF *this)

{
  RegisterDepfileParserTestUnifyMixedRulesLF *this_local;
  
  RegisterTest(DepfileParserTestUnifyMixedRulesLF::Create,"DepfileParserTest.UnifyMixedRulesLF");
  return;
}

Assistant:

TEST_F(DepfileParserTest, UnifyMixedRulesLF) {
  string err;
  EXPECT_TRUE(Parse("foo: x\\\n"
                    "     y\n"
                    "foo \\\n"
                    "foo: z\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}